

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O0

void __thiscall HDual::major_chooseRow(HDual *this)

{
  double dVar1;
  long lVar2;
  HDualRHS *pHVar3;
  int iVar4;
  reference pvVar5;
  size_type sVar6;
  undefined8 uStack_c0;
  undefined1 auStack_b8 [4];
  int iStack_b4;
  ulong auStack_b0 [2];
  int local_9c;
  double local_98;
  int local_8c;
  double local_88;
  undefined1 *local_80;
  HDual *local_78;
  int iRow_2;
  int i_2;
  double pamiCutoff;
  double c_weight;
  double u_weight;
  int iRow_1;
  int i_1;
  int countWrongEdWt;
  int ich_2;
  int ich_1;
  int ich;
  int iRow;
  int i;
  int choiceCount;
  unsigned_long __vla_expr0;
  int local_14;
  HDual *pHStack_10;
  int initialCount;
  HDual *this_local;
  
  pHStack_10 = this;
  local_78 = this;
  if (this->model->countUpdate == 0) {
    this->multi_chooseAgain = 1;
  }
  if (this->multi_chooseAgain != 0) {
    this->multi_chooseAgain = 0;
    this->multi_iteration = this->multi_iteration + 1;
    local_14 = 0;
    __vla_expr0 = (unsigned_long)auStack_b8;
    lVar2 = -((ulong)(uint)this->multi_num * 4 + 0xf & 0xfffffffffffffff0);
    local_80 = auStack_b8 + lVar2;
    _choiceCount = (ulong)(uint)this->multi_num;
    *(undefined8 *)((long)&uStack_c0 + lVar2) = 0x15a27f;
    HDualRHS::choose_multi_HGauto
              (*(HDualRHS **)(&stack0xffffffffffffff60 + lVar2),
               *(int **)((long)auStack_b0 + lVar2 + 8),*(int **)((long)auStack_b0 + lVar2),
               *(int *)((long)&iStack_b4 + lVar2));
    if (((local_14 != 0) || (dVar1 = (local_78->dualRHS).workCutoff, dVar1 != 0.0)) || (NAN(dVar1)))
    {
      iRow = 0;
      for (ich = 0; ich < local_14; ich = ich + 1) {
        ich_1 = *(int *)(local_80 + (long)ich * 4);
        pHVar3 = &local_78->dualRHS;
        sVar6 = (size_type)ich_1;
        *(undefined8 *)((long)&uStack_c0 + lVar2) = 0x15a2e8;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&pHVar3->workArray,sVar6);
        local_88 = *pvVar5;
        pHVar3 = &local_78->dualRHS;
        sVar6 = (size_type)ich_1;
        *(undefined8 *)((long)&uStack_c0 + lVar2) = 0x15a309;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&pHVar3->workEdWt,sVar6);
        iVar4 = iRow;
        if ((local_78->dualRHS).workCutoff <= local_88 / *pvVar5) {
          iRow = iRow + 1;
          *(int *)(local_80 + (long)iVar4 * 4) = ich_1;
        }
      }
      if ((local_14 == 0) || (local_8c = iRow, iRow <= local_14 / 3)) {
        *(undefined8 *)((long)&uStack_c0 + lVar2) = 0x15a38c;
        HDualRHS::create_infeasList
                  (*(HDualRHS **)(&stack0x00000010 + lVar2),*(double *)(&stack0x00000008 + lVar2));
        i = 3;
      }
      else {
        for (ich_2 = 0; ich_2 < local_78->multi_num; ich_2 = ich_2 + 1) {
          local_78->multi_choice[ich_2].rowOut = -1;
        }
        for (countWrongEdWt = 0; countWrongEdWt < iRow; countWrongEdWt = countWrongEdWt + 1) {
          local_78->multi_choice[countWrongEdWt].rowOut =
               *(int *)(local_80 + (long)countWrongEdWt * 4);
        }
        *(undefined8 *)((long)&uStack_c0 + lVar2) = 0x15a41f;
        major_chooseRowBtran(*(HDual **)(&stack0x00000280 + lVar2));
        for (i_1 = 0; i_1 < local_78->multi_num; i_1 = i_1 + 1) {
          if (-1 < local_78->multi_choice[i_1].rowOut) {
            local_78->row_epDensity = local_78->row_epDensity * 0.95;
            local_78->row_epDensity =
                 ((double)local_78->multi_choice[i_1].row_ep.count * 0.05) /
                 (double)local_78->numRow + local_78->row_epDensity;
          }
        }
        iRow_1 = 0;
        for (u_weight._4_4_ = 0; u_weight._4_4_ < local_78->multi_num;
            u_weight._4_4_ = u_weight._4_4_ + 1) {
          u_weight._0_4_ = local_78->multi_choice[u_weight._4_4_].rowOut;
          if (-1 < u_weight._0_4_) {
            pHVar3 = &local_78->dualRHS;
            sVar6 = (size_type)u_weight._0_4_;
            *(undefined8 *)((long)&uStack_c0 + lVar2) = 0x15a525;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&pHVar3->workEdWt,sVar6);
            c_weight = *pvVar5;
            local_98 = local_78->multi_choice[u_weight._4_4_].infeasEdWt;
            pHVar3 = &local_78->dualRHS;
            sVar6 = (size_type)u_weight._0_4_;
            *(undefined8 *)((long)&uStack_c0 + lVar2) = 0x15a56a;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&pHVar3->workEdWt,sVar6);
            *pvVar5 = local_98;
            pamiCutoff = local_98;
            if (c_weight < local_98 * 0.25) {
              local_78->multi_choice[u_weight._4_4_].rowOut = -1;
              iRow_1 = iRow_1 + 1;
            }
          }
        }
        local_9c = iRow_1;
        if (iRow / 3 < iRow_1) {
          i = 0;
        }
        else {
          i = 2;
        }
      }
    }
    else {
      i = 1;
    }
    auStack_b0[1] = (ulong)(uint)i;
    (*(code *)(&DAT_001ccab0 + *(int *)(&DAT_001ccab0 + auStack_b0[1] * 4)))();
    return;
  }
  return;
}

Assistant:

void HDual::major_chooseRow() {

    /**
     * 0. Initial check to see if we need to do it again
     */
    if (model->countUpdate == 0)
        multi_chooseAgain = 1;
    if (!multi_chooseAgain)
        return;
    multi_chooseAgain = 0;
    multi_iteration++;

    /**
     * Major loop:
     *     repeat 1-5, until we found a good sets of choices
     */
    for (;;) {
        // 1. Multiple CHUZR
        int initialCount = 0;
        int choiceIndex[multi_num];
        dualRHS.choose_multi_HGauto(&choiceIndex[0], &initialCount, multi_num);
//        dualRHS.choose_multi_global(&choiceIndex[0], &initialCount, multi_num);
        if (initialCount == 0 && dualRHS.workCutoff == 0) {
            // OPTIMAL
            return;
        }

        // 2. Shrink the size by cutoff
        int choiceCount = 0;
        for (int i = 0; i < initialCount; i++) {
            int iRow = choiceIndex[i];
            if (dualRHS.workArray[iRow] / dualRHS.workEdWt[iRow]
                    >= dualRHS.workCutoff) {
                choiceIndex[choiceCount++] = iRow;
            }
        }
        if (initialCount == 0 || choiceCount <= initialCount / 3) {
            // Need to do the list again
            dualRHS.create_infeasList(columnDensity);
            continue;
        }

        // 3. Store the choiceIndex to buffer
        for (int ich = 0; ich < multi_num; ich++)
            multi_choice[ich].rowOut = -1;
        for (int ich = 0; ich < choiceCount; ich++)
            multi_choice[ich].rowOut = choiceIndex[ich];

        // 4. Parallel BTRAN and compute weight
        major_chooseRowBtran();

        // 5. Update row weights
        for (int ich = 0; ich < multi_num; ich++) {
            if (multi_choice[ich].rowOut >= 0) {
                row_epDensity *= 0.95;
                row_epDensity += 0.05 * multi_choice[ich].row_ep.count / numRow;
            }
        }

        // 6. Check updated and computed weight
        int countWrongEdWt = 0;
        for (int i = 0; i < multi_num; i++) {
            const int iRow = multi_choice[i].rowOut;
            if (iRow < 0)
                continue;
            double u_weight = dualRHS.workEdWt[iRow];
            double c_weight = dualRHS.workEdWt[iRow] =
                    multi_choice[i].infeasEdWt;
            if (u_weight < 0.25 * c_weight) {
                multi_choice[i].rowOut = -1;
                countWrongEdWt++;
            }
        }
        if (countWrongEdWt <= choiceCount / 3)
            break;
    }

    // 6. Take other info associated with choices
    double pamiCutoff = model->dblOption[DBLOPT_PAMI_CUTOFF];
    for (int i = 0; i < multi_num; i++) {
        const int iRow = multi_choice[i].rowOut;
        if (iRow < 0)
            continue;
        // Other info
        multi_choice[i].baseValue = baseValue[iRow];
        multi_choice[i].baseLower = baseLower[iRow];
        multi_choice[i].baseUpper = baseUpper[iRow];
        multi_choice[i].infeasValue = dualRHS.workArray[iRow];
        multi_choice[i].infeasEdWt = dualRHS.workEdWt[iRow];
        multi_choice[i].infeasLimit = dualRHS.workArray[iRow]
                / dualRHS.workEdWt[iRow];
        multi_choice[i].infeasLimit *= pamiCutoff;
    }

    // 6. Finish count
    multi_nFinish = 0;
}